

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall cmTarget::cmTarget(cmTarget *this)

{
  Snapshot snapshot;
  cmCommandContext local_60;
  Snapshot local_38;
  cmTarget *local_10;
  cmTarget *this_local;
  
  local_10 = this;
  cmPropertyMap::cmPropertyMap(&this->Properties);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->SystemIncludeDirectories);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->LinkDirectoriesEmmitted);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->Utilities);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_>_>
  ::map(&this->UtilityBacktraces);
  cmPolicies::PolicyMap::PolicyMap(&this->PolicyMap);
  std::__cxx11::string::string((string *)&this->Name);
  std::__cxx11::string::string((string *)&this->InstallPath);
  std::__cxx11::string::string((string *)&this->RuntimeInstallPath);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->LinkDirectories);
  std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::vector(&this->PreBuildCommands);
  std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::vector(&this->PreLinkCommands);
  std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::vector(&this->PostBuildCommands);
  std::
  vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
  ::vector(&this->TLLCommands);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
  ::vector(&this->PrevLinkedLibraries);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
  ::vector(&this->OriginalLinkLibraries);
  cmTargetInternalPointer::cmTargetInternalPointer(&this->Internal);
  cmState::Snapshot::Snapshot(&local_38,(cmState *)0x0);
  cmCommandContext::cmCommandContext(&local_60);
  snapshot.Position.Tree = local_38.Position.Tree;
  snapshot.State = local_38.State;
  snapshot.Position.Position = local_38.Position.Position;
  cmListFileBacktrace::cmListFileBacktrace(&this->Backtrace,snapshot,&local_60);
  cmCommandContext::~cmCommandContext(&local_60);
  this->Makefile = (cmMakefile *)0x0;
  this->HaveInstallRule = false;
  this->DLLPlatform = false;
  this->IsAndroid = false;
  this->IsImportedTarget = false;
  this->ImportedGloballyVisible = false;
  this->BuildInterfaceIncludesAppended = false;
  return;
}

Assistant:

cmTarget::cmTarget()
{
  this->Makefile = 0;
#if defined(_WIN32) && !defined(__CYGWIN__)
  this->LinkLibrariesForVS6Analyzed = false;
#endif
  this->HaveInstallRule = false;
  this->DLLPlatform = false;
  this->IsAndroid = false;
  this->IsImportedTarget = false;
  this->ImportedGloballyVisible = false;
  this->BuildInterfaceIncludesAppended = false;
}